

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O1

Mtbdd __thiscall sylvan::Mtbdd::AndExists(Mtbdd *this,Mtbdd *other,BddSet *variables)

{
  char *in_RCX;
  Task local_50;
  
  local_50.d._0_8_ = other->mtbdd;
  local_50.d._8_8_ = (variables->set).bdd;
  local_50.d._16_8_ = *(undefined8 *)in_RCX;
  local_50.f = mtbdd_and_abstract_plus_WRAP;
  local_50.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
  lace_run_task(&local_50);
  this->mtbdd = local_50.d._0_8_;
  mtbdd_protect(&this->mtbdd);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::AndExists(const Mtbdd &other, const BddSet &variables) const
{
    return mtbdd_and_exists(mtbdd, other.mtbdd, variables.set.bdd);
}